

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.h
# Opt level: O1

string * __thiscall
TgBot::TgTypeParser::parse2DArray<TgBot::PhotoSize>
          (string *__return_storage_ptr__,TgTypeParser *this,
          TgTypeToJsonFunc<TgBot::PhotoSize> parseFunc,
          vector<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>,_std::allocator<std::vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>_>_>
          *objects)

{
  long lVar1;
  pointer pcVar2;
  undefined8 uVar3;
  size_type sVar4;
  char cVar5;
  long *in_R8;
  long lVar6;
  string local_50;
  
  lVar6 = *in_R8;
  lVar1 = in_R8[1];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar6 == lVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar5 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar5);
    lVar1 = in_R8[1];
    for (lVar6 = *in_R8; lVar6 != lVar1; lVar6 = lVar6 + 0x18) {
      parseArray<TgBot::PhotoSize>
                (&local_50,this,parseFunc,
                 (vector<std::shared_ptr<TgBot::PhotoSize>,_std::allocator<std::shared_ptr<TgBot::PhotoSize>_>_>
                  *)objects);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::push_back(cVar5);
    }
    sVar4 = __return_storage_ptr__->_M_string_length - 1;
    if (__return_storage_ptr__->_M_string_length == 0) {
      uVar3 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &__return_storage_ptr__->field_2) {
        operator_delete(pcVar2);
      }
      _Unwind_Resume(uVar3);
    }
    __return_storage_ptr__->_M_string_length = sVar4;
    (__return_storage_ptr__->_M_dataplus)._M_p[sVar4] = '\0';
    std::__cxx11::string::push_back(cVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parse2DArray(TgTypeToJsonFunc<T> parseFunc, const std::vector<std::vector<std::shared_ptr<T>>>& objects) const {
        if (objects.empty())
            return "";
        std::string result;
        result += '[';
        for (const std::vector<std::shared_ptr<T>>& item : objects) {
            result += parseArray(parseFunc, item);
            result += ',';
        }
        result.erase(result.length() - 1);
        result += ']';
        return result;
    }